

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

Vector<unsigned_int,_4> __thiscall
gl4cts::Math::convertBvecToUvec<4>(Math *this,Vector<bool,_4> *src)

{
  bool *pbVar1;
  uint *puVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  Vector<unsigned_int,_4> VVar4;
  undefined4 local_1c;
  GLint i;
  Vector<bool,_4> *src_local;
  Vector<unsigned_int,_4> *result;
  
  tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this);
  uVar3 = extraout_RDX;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    pbVar1 = tcu::Vector<bool,_4>::operator[](src,local_1c);
    if ((*pbVar1 & 1U) == 0) {
      puVar2 = tcu::Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)this,local_1c);
      *puVar2 = 0;
      uVar3 = extraout_RDX_01;
    }
    else {
      puVar2 = tcu::Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)this,local_1c);
      *puVar2 = 1;
      uVar3 = extraout_RDX_00;
    }
  }
  VVar4.m_data[2] = (int)uVar3;
  VVar4.m_data[3] = (int)((ulong)uVar3 >> 0x20);
  VVar4.m_data._0_8_ = this;
  return (Vector<unsigned_int,_4>)VVar4.m_data;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> convertBvecToUvec(const tcu::Vector<bool, Size>& src)
{
	tcu::Vector<glw::GLuint, Size> result;

	for (glw::GLint i = 0; i < Size; ++i)
	{
		if (GL_FALSE != src[i])
		{
			result[i] = 1;
		}
		else
		{
			result[i] = 0;
		}
	}

	return result;
}